

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O0

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::erase
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,iterator *i)

{
  int64_t c;
  iterator *i_local;
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this_local;
  
  c = list<r_exec::CInput>::_erase(&this->super_list<r_exec::CInput>,i->_cell);
  iterator::iterator((iterator *)&this_local,this,c);
  return _this_local;
}

Assistant:

iterator erase(iterator &i)
    {
        return iterator(this, this->_erase(i._cell));
    }